

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.cpp
# Opt level: O2

vec2 __thiscall CFlow::Get(CFlow *this,vec2 Pos)

{
  undefined4 uVar1;
  undefined4 uVar3;
  CCell CVar2;
  vec2 vVar4;
  undefined1 auVar5 [16];
  undefined4 in_ECX;
  int iVar6;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar7;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar8;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  int iVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar10._8_4_ = in_XMM0_Dc;
  auVar10._0_8_ = Pos;
  auVar10._12_4_ = in_XMM0_Dd;
  aVar7.x = 0.0;
  aVar8.y = 0.0;
  if (this->m_pCells != (CCell *)0x0) {
    auVar12._0_4_ = (float)this->m_Spacing;
    auVar12._4_4_ = auVar12._0_4_;
    auVar12._8_4_ = auVar12._0_4_;
    auVar12._12_4_ = auVar12._0_4_;
    auVar10 = divps(auVar10,auVar12);
    iVar9 = (int)auVar10._0_4_;
    iVar11 = (int)auVar10._4_4_;
    auVar13._4_4_ = iVar11;
    auVar13._0_4_ = iVar11;
    auVar13._8_4_ = iVar9;
    auVar13._12_4_ = iVar9;
    iVar6 = movmskpd(in_ECX,auVar13);
    if (iVar6 == 0) {
      uVar1 = this->m_Height;
      uVar3 = this->m_Width;
      auVar5._4_4_ = -(uint)(iVar11 < (int)uVar1);
      auVar5._0_4_ = -(uint)(iVar11 < (int)uVar1);
      auVar5._8_4_ = -(uint)(iVar9 < (int)uVar3);
      auVar5._12_4_ = -(uint)(iVar9 < (int)uVar3);
      iVar6 = movmskpd(0,auVar5);
      if (iVar6 == 3) {
        CVar2.m_Vel = this->m_pCells[(uint)(iVar9 + iVar11 * uVar3)].m_Vel;
        aVar7 = CVar2.m_Vel.field_0;
        aVar8 = CVar2.m_Vel.field_1;
      }
    }
  }
  vVar4.field_1.y = aVar8.y;
  vVar4.field_0.x = aVar7.x;
  return vVar4;
}

Assistant:

vec2 CFlow::Get(vec2 Pos)
{
	if(!m_pCells)
		return vec2(0,0);

	int x = (int)(Pos.x / m_Spacing);
	int y = (int)(Pos.y / m_Spacing);
	if(x < 0 || y < 0 || x >= m_Width || y >= m_Height)
		return vec2(0,0);

	return m_pCells[y*m_Width+x].m_Vel;
}